

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

bool genVulkanFunctionsPC
               (QList<VkSpecParser::Command> *commands,
               QMap<QString,_QList<QString>_> *versionCommandMapping,QString *licHeaderFn,
               QString *outputBase)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  QArrayData *key;
  uint uVar6;
  char *className;
  QString *pQVar7;
  uint uVar8;
  char16_t *pcVar9;
  Command *c;
  Command *c_00;
  ulong uVar10;
  long lVar11;
  QString *pQVar12;
  char16_t *pcVar13;
  long in_FS_OFFSET;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  uint local_19c;
  uint local_198;
  QList<VkSpecParser::Command> *__range2;
  QString local_160;
  QString local_148;
  QString local_130;
  QString local_118;
  QArrayDataPointer<QString> local_100;
  QString local_e8;
  QString local_c8;
  QString local_a8;
  QStringBuilder<const_QString_&,_QString> local_88;
  QString local_68;
  QByteArray local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_88.b.d.d = (Data *)0x0;
  local_88.b.d.ptr = L"_p.cpp";
  local_88.b.d.size = 6;
  local_88.a = outputBase;
  QStringBuilder<const_QString_&,_QString>::convertTo<QString>(&local_68,&local_88);
  QFile::QFile((QFile *)&local_48,&local_68);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.b.d.d)->super_QArrayData,2,0x10);
    }
  }
  cVar3 = QFile::open(&local_48,0x12);
  if (cVar3 == '\0') {
    genVulkanFunctionsPC();
  }
  else {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    uVar10 = 0;
    local_68.d.size = 0;
    local_a8.d.size = 0;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    local_c8.d.size = 0;
    local_c8.d.d = (Data *)0x0;
    local_c8.d.ptr = (char16_t *)0x0;
    local_e8.d.size = 0;
    local_e8.d.d = (Data *)0x0;
    local_e8.d.ptr = (char16_t *)0x0;
    uVar6 = 0;
    if (VERSIONS.d.size != 0) {
      pQVar7 = VERSIONS.d.ptr + VERSIONS.d.size;
      uVar5 = 0;
      uVar6 = 0;
      local_198 = 0;
      local_19c = 0;
      key = (QArrayData *)VERSIONS.d.ptr;
      do {
        local_88.a = (QString *)0x0;
        local_88.b.d.d = (Data *)0x0;
        local_88.b.d.ptr = (char16_t *)0x0;
        QMap<QString,_QList<QString>_>::value
                  ((QList<QString> *)&local_100,versionCommandMapping,(QString *)key,
                   (QList<QString> *)&local_88);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_88);
        local_88.a = (QString *)anon_var_dwarf_19740;
        local_88.b.d.ptr = L"\n";
        local_88.b.d.d = (Data *)key;
        operator+=(&local_a8,
                   (QStringBuilder<QStringBuilder<const_char_(&)[6],_const_QString_&>,_const_char_(&)[2]>
                    *)&local_88);
        local_88.a = (QString *)anon_var_dwarf_19740;
        local_88.b.d.ptr = L"\n";
        local_88.b.d.d = (Data *)key;
        operator+=(&local_68,
                   (QStringBuilder<QStringBuilder<const_char_(&)[6],_const_QString_&>,_const_char_(&)[2]>
                    *)&local_88);
        lVar11 = (commands->d).size;
        if (lVar11 != 0) {
          c_00 = (commands->d).ptr;
          lVar11 = lVar11 * 0x68;
          do {
            QVar16.m_data = (c_00->cmd).name.d.ptr;
            QVar16.m_size = (c_00->cmd).name.d.size;
            cVar4 = QtPrivate::QStringList_contains((QList *)&local_100,QVar16,CaseSensitive);
            if (cVar4 != '\0') {
              bVar1 = c_00->deviceLevel;
              pQVar12 = &local_a8;
              if (bVar1 != false) {
                pQVar12 = &local_68;
              }
              className = "QVulkanFunctions";
              if (bVar1 != false) {
                className = "QVulkanDeviceFunctions";
              }
              funcSig((QString *)&local_88,c_00,className);
              QString::append(pQVar12);
              if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
                }
              }
              local_118.d.d = (Data *)0x0;
              local_118.d.ptr = L"\n{\n    Q_ASSERT(d_ptr->m_funcs[%1]);\n    ";
              local_118.d.size = 0x29;
              uVar8 = local_19c;
              if (bVar1 != false) {
                uVar8 = local_198;
              }
              QString::arg_impl((longlong)&local_88,(int)&local_118,uVar8,(QChar)0x0);
              QString::append(pQVar12);
              if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
                }
              }
              if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
                }
              }
              funcCall((QString *)&local_88,c_00,uVar8);
              QString::append(pQVar12);
              if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
                }
              }
              local_88.a = (QString *)0x0;
              local_88.b.d.d = (Data *)0x10b236;
              local_88.b.d.ptr = (char16_t *)0x5;
              QString::append(pQVar12);
              if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
                }
              }
              uVar2 = uVar8 + 1;
              if (bVar1 != false) {
                local_198 = uVar8 + 1;
                uVar2 = local_19c;
              }
              local_19c = uVar2;
              pQVar12 = &local_c8;
              if (c_00->deviceLevel == false) {
                pQVar12 = &local_e8;
              }
              local_88.a = (QString *)0x0;
              local_88.b.d.d = (Data *)0x10b242;
              local_88.b.d.ptr = (char16_t *)0x9;
              QString::append(pQVar12);
              if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
                }
              }
              QString::append(pQVar12);
              local_88.a = (QString *)0x0;
              local_88.b.d.d = (Data *)0x10b256;
              local_88.b.d.ptr = (char16_t *)0x3;
              QString::append(pQVar12);
              if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
                }
              }
            }
            c_00 = c_00 + 1;
            lVar11 = lVar11 + -0x68;
          } while (lVar11 != 0);
        }
        lVar11._0_4_ = key[1].ref_;
        lVar11._4_4_ = key[1].flags;
        if ((lVar11 != 0xe) ||
           (QVar14.m_data = (char16_t *)key->alloc, QVar14.m_size = 0xe,
           QVar15.m_data = L"VK_VERSION_1_0", QVar15.m_size = 0xe,
           cVar4 = QtPrivate::equalStrings(QVar14,QVar15), uVar8 = local_19c, uVar2 = local_198,
           cVar4 == '\0')) {
          uVar8 = uVar6;
          uVar2 = uVar5;
        }
        uVar5 = uVar2;
        uVar6 = uVar8;
        uVar10 = (ulong)uVar5;
        QString::append(&local_a8,"#endif\n\n",8);
        QString::append(&local_68,"#endif\n\n",8);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_100);
        key = (QArrayData *)&key[1].alloc;
      } while (key != (QArrayData *)pQVar7);
      if (2 < (ulong)local_c8.d.size) {
        QString::chop((longlong)&local_c8);
      }
    }
    if (2 < (ulong)local_e8.d.size) {
      QString::chop((longlong)&local_e8);
    }
    local_88.b.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_88.a = (QString *)0xaaaaaaaaaaaaaaaa;
    local_88.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    Preamble::get((QByteArray *)&local_100,&preamble,licHeaderFn);
    pQVar7 = local_100.ptr;
    if (local_100.ptr == (QString *)0x0) {
      pQVar7 = (QString *)&QByteArray::_empty;
    }
    QString::toUtf8_helper(&local_118);
    pcVar13 = local_118.d.ptr;
    if (local_118.d.ptr == (char16_t *)0x0) {
      pcVar13 = (char16_t *)&QByteArray::_empty;
    }
    QString::toUtf8_helper(&local_130);
    pcVar9 = local_130.d.ptr;
    if (local_130.d.ptr == (char16_t *)0x0) {
      pcVar9 = (char16_t *)&QByteArray::_empty;
    }
    QString::toUtf8_helper(&local_148);
    if (local_148.d.ptr == (char16_t *)0x0) {
      local_148.d.ptr = (char16_t *)&QByteArray::_empty;
    }
    QString::toUtf8_helper(&local_160);
    if (local_160.d.ptr == (char16_t *)0x0) {
      local_160.d.ptr = (char16_t *)&QByteArray::_empty;
    }
    QString::asprintf((char *)&local_88,
                      "%s\n#include \"qvulkanfunctions_p.h\"\n#include \"qvulkaninstance.h\"\n\n#include <QtCore/private/qoffsetstringarray_p.h>\n\nQT_BEGIN_NAMESPACE\n\n%sQVulkanFunctionsPrivate::QVulkanFunctionsPrivate(QVulkanInstance *inst)\n{\n    static constexpr auto funcNames = qOffsetStringArray(\n%s\n    );\n    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n    for (int i = 0; i < funcNames.count(); ++i) {\n        m_funcs[i] = inst->getInstanceProcAddr(funcNames.at(i));\n        if (i < %d && !m_funcs[i])\n            qWarning(\"QVulkanFunctions: Failed to resolve %%s\", funcNames.at(i));\n    }\n}\n\n%sQVulkanDeviceFunctionsPrivate::QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device)\n{\n    QVulkanFunctions *f = inst->functions();\n    Q_ASSERT(f);\n\n    static constexpr auto funcNames = qOffsetStringArray(\n%s\n    );\n    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n    for (int i = 0; i < funcNames.count(); ++i) {\n        m_funcs[i] = f->vkGetDeviceProcAddr(device, funcNames.at(i));\n        if (i < %d && !m_funcs[i])\n            qWarning(\"QVulkanDeviceFunctions: Failed to resolve %%s\", funcNames.at(i));\n    }\n}\n\nQT_END_NAMESPACE\n"
                      ,pQVar7,pcVar13,pcVar9,(ulong)uVar6,local_148.d.ptr,local_160.d.ptr,uVar10);
    if (&(local_160.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_130.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_130.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_100.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_100.d)->super_QArrayData,1,0x10);
      }
    }
    QString::toUtf8_helper((QString *)&local_100);
    QIODevice::write(&local_48);
    if (&(local_100.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_100.d)->super_QArrayData,1,0x10);
      }
    }
    if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
      }
    }
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
    return (bool)cVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool genVulkanFunctionsPC(const QList<VkSpecParser::Command> &commands,
                          const QMap<QString, QStringList> &versionCommandMapping,
                          const QString &licHeaderFn,
                          const QString &outputBase)
{
    QFile f(outputBase + QStringLiteral("_p.cpp"));
    if (!f.open(QIODevice::WriteOnly | QIODevice::Text)) {
        qWarning("Failed to write %s", qPrintable(f.fileName()));
        return false;
    }

    static const char s[] =
"%s\n"
"#include \"qvulkanfunctions_p.h\"\n"
"#include \"qvulkaninstance.h\"\n"
"\n"
"#include <QtCore/private/qoffsetstringarray_p.h>\n"
"\n"
"QT_BEGIN_NAMESPACE\n"
"\n%s"
"QVulkanFunctionsPrivate::QVulkanFunctionsPrivate(QVulkanInstance *inst)\n"
"{\n"
"    static constexpr auto funcNames = qOffsetStringArray(\n"
"%s\n"
"    );\n"
"    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n"
"    for (int i = 0; i < funcNames.count(); ++i) {\n"
"        m_funcs[i] = inst->getInstanceProcAddr(funcNames.at(i));\n"
"        if (i < %d && !m_funcs[i])\n"
"            qWarning(\"QVulkanFunctions: Failed to resolve %%s\", funcNames.at(i));\n"
"    }\n"
"}\n"
"\n%s"
"QVulkanDeviceFunctionsPrivate::QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device)\n"
"{\n"
"    QVulkanFunctions *f = inst->functions();\n"
"    Q_ASSERT(f);\n\n"
"    static constexpr auto funcNames = qOffsetStringArray(\n"
"%s\n"
"    );\n"
"    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n"
"    for (int i = 0; i < funcNames.count(); ++i) {\n"
"        m_funcs[i] = f->vkGetDeviceProcAddr(device, funcNames.at(i));\n"
"        if (i < %d && !m_funcs[i])\n"
"            qWarning(\"QVulkanDeviceFunctions: Failed to resolve %%s\", funcNames.at(i));\n"
"    }\n"
"}\n"
"\n"
"QT_END_NAMESPACE\n";

    QString devCmdWrapperStr;
    QString instCmdWrapperStr;
    int devIdx = 0;
    int instIdx = 0;
    QString devCmdNamesStr;
    QString instCmdNamesStr;
    int vulkan10DevCount = 0;
    int vulkan10InstCount = 0;

    for (const QString &version : VERSIONS) {
        const QStringList &coreFunctionsInVersion = versionCommandMapping[version];
        instCmdWrapperStr += "\n#if " + version + "\n";
        devCmdWrapperStr += "\n#if " + version + "\n";
        for (const VkSpecParser::Command &c : commands) {
            if (!coreFunctionsInVersion.contains(c.cmd.name))
                continue;

            QString *dst = c.deviceLevel ? &devCmdWrapperStr : &instCmdWrapperStr;
            int *idx = c.deviceLevel ? &devIdx : &instIdx;
            *dst += funcSig(c, c.deviceLevel ? "QVulkanDeviceFunctions" : "QVulkanFunctions");
            *dst += QString(QStringLiteral("\n{\n    Q_ASSERT(d_ptr->m_funcs[%1]);\n    ")).arg(*idx);
            *dst += funcCall(c, *idx);
            *dst += QStringLiteral(";\n}\n\n");
            *idx += 1;

            dst = c.deviceLevel ? &devCmdNamesStr : &instCmdNamesStr;
            *dst += QStringLiteral("        \"");
            *dst += c.cmd.name;
            *dst += QStringLiteral("\",\n");
        }
        if (version == QStringLiteral("VK_VERSION_1_0")) {
            vulkan10InstCount = instIdx;
            vulkan10DevCount = devIdx;
        }
        instCmdWrapperStr += "#endif\n\n";
        devCmdWrapperStr += "#endif\n\n";
    }

    if (devCmdNamesStr.size() > 2)
        devCmdNamesStr.chop(2);
    if (instCmdNamesStr.size() > 2)
        instCmdNamesStr.chop(2);

    const QString str =
            QString::asprintf(s, preamble.get(licHeaderFn).constData(),
                              instCmdWrapperStr.toUtf8().constData(),
                              instCmdNamesStr.toUtf8().constData(), vulkan10InstCount,
                              devCmdWrapperStr.toUtf8().constData(),
                              devCmdNamesStr.toUtf8().constData(), vulkan10DevCount);

    f.write(str.toUtf8());

    return true;
}